

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::append
          (ReorderingBuffer *this,UChar *s,int32_t length,UBool isNFD,uint8_t leadCC,uint8_t trailCC
          ,UErrorCode *errorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  Normalizer2Impl *this_00;
  UBool UVar3;
  uint16_t uVar4;
  UChar *pUVar5;
  int iVar6;
  uint local_38;
  uint16_t __c2_1;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  UChar *sLimit;
  uint8_t trailCC_local;
  uint8_t leadCC_local;
  UBool isNFD_local;
  UChar *pUStack_20;
  int32_t length_local;
  UChar *s_local;
  ReorderingBuffer *this_local;
  
  if (length == 0) {
    this_local._7_1_ = '\x01';
  }
  else if ((this->remainingCapacity < length) &&
          (UVar3 = resize(this,length,errorCode), UVar3 == '\0')) {
    this_local._7_1_ = '\0';
  }
  else {
    this->remainingCapacity = this->remainingCapacity - length;
    if ((leadCC < this->lastCC) && (leadCC != '\0')) {
      ___c2_1 = 1;
      local_38 = (uint)(ushort)*s;
      iVar6 = 1;
      if ((((local_38 & 0xfffffc00) == 0xd800) && (length != 1)) &&
         (iVar6 = ___c2_1, (s[1] & 0xfc00U) == 0xdc00)) {
        local_38 = local_38 * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
        iVar6 = 2;
      }
      ___c2_1 = iVar6;
      insert(this,local_38,leadCC);
      while (___c2_1 < length) {
        iVar6 = ___c2_1 + 1;
        local_38 = (uint)(ushort)s[___c2_1];
        if ((((local_38 & 0xfffffc00) == 0xd800) && (iVar6 != length)) &&
           ((s[iVar6] & 0xfc00U) == 0xdc00)) {
          local_38 = local_38 * 0x400 + (uint)(ushort)s[iVar6] + 0xfca02400;
          iVar6 = ___c2_1 + 2;
        }
        ___c2_1 = iVar6;
        sLimit._2_1_ = trailCC;
        if (___c2_1 < length) {
          if (isNFD == '\0') {
            this_00 = this->impl;
            uVar4 = Normalizer2Impl::getNorm16(this->impl,local_38);
            sLimit._2_1_ = Normalizer2Impl::getCC(this_00,uVar4);
          }
          else {
            uVar4 = Normalizer2Impl::getRawNorm16(this->impl,local_38);
            sLimit._2_1_ = Normalizer2Impl::getCCFromYesOrMaybe(uVar4);
          }
        }
        append(this,local_38,sLimit._2_1_,errorCode);
      }
    }
    else {
      if (trailCC < 2) {
        this->reorderStart = this->limit + length;
      }
      else if (leadCC < 2) {
        this->reorderStart = this->limit + 1;
      }
      pUStack_20 = s;
      do {
        pUVar5 = pUStack_20 + 1;
        UVar1 = *pUStack_20;
        pUVar2 = this->limit;
        this->limit = pUVar2 + 1;
        *pUVar2 = UVar1;
        pUStack_20 = pUVar5;
      } while (pUVar5 != s + length);
      this->lastCC = trailCC;
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool ReorderingBuffer::append(const UChar *s, int32_t length, UBool isNFD,
                               uint8_t leadCC, uint8_t trailCC,
                               UErrorCode &errorCode) {
    if(length==0) {
        return TRUE;
    }
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=length;
    if(lastCC<=leadCC || leadCC==0) {
        if(trailCC<=1) {
            reorderStart=limit+length;
        } else if(leadCC<=1) {
            reorderStart=limit+1;  // Ok if not a code point boundary.
        }
        const UChar *sLimit=s+length;
        do { *limit++=*s++; } while(s!=sLimit);
        lastCC=trailCC;
    } else {
        int32_t i=0;
        UChar32 c;
        U16_NEXT(s, i, length, c);
        insert(c, leadCC);  // insert first code point
        while(i<length) {
            U16_NEXT(s, i, length, c);
            if(i<length) {
                if (isNFD) {
                    leadCC = Normalizer2Impl::getCCFromYesOrMaybe(impl.getRawNorm16(c));
                } else {
                    leadCC = impl.getCC(impl.getNorm16(c));
                }
            } else {
                leadCC=trailCC;
            }
            append(c, leadCC, errorCode);
        }
    }
    return TRUE;
}